

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1048576,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  RTCIntersectArguments *pRVar6;
  bool bVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  byte bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  byte bVar22;
  undefined1 (*pauVar23) [32];
  long lVar24;
  byte bVar25;
  undefined1 (*pauVar26) [32];
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined4 uVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar71;
  uint uVar72;
  uint uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_25ec;
  int local_25c4;
  ulong local_25c0;
  ulong *local_25b8;
  RayQueryContext *local_25b0;
  long local_25a8;
  long local_25a0;
  Geometry *local_2598;
  Scene *local_2590;
  RTCFilterFunctionNArguments local_2588;
  float local_2558;
  undefined4 local_2554;
  undefined4 local_2550;
  undefined4 local_254c;
  undefined4 local_2548;
  undefined4 local_2544;
  uint local_2540;
  uint local_253c;
  uint local_2538;
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  undefined1 local_24d8 [16];
  byte local_24c7;
  float local_24b8 [4];
  float local_24a8 [4];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  undefined1 auVar49 [32];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_25b8 = local_2368;
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_2370[0] = 0;
    auVar34 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar31._8_4_ = 0x7fffffff;
    auVar31._0_8_ = 0x7fffffff7fffffff;
    auVar31._12_4_ = 0x7fffffff;
    auVar31 = vandps_avx512vl((undefined1  [16])aVar3,auVar31);
    auVar69._8_4_ = 0x219392ef;
    auVar69._0_8_ = 0x219392ef219392ef;
    auVar69._12_4_ = 0x219392ef;
    uVar8 = vcmpps_avx512vl(auVar31,auVar69,1);
    bVar7 = (bool)((byte)uVar8 & 1);
    auVar32._0_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * (int)aVar3.x;
    bVar7 = (bool)((byte)(uVar8 >> 1) & 1);
    auVar32._4_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * (int)aVar3.y;
    bVar7 = (bool)((byte)(uVar8 >> 2) & 1);
    auVar32._8_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * (int)aVar3.z;
    bVar7 = (bool)((byte)(uVar8 >> 3) & 1);
    auVar32._12_4_ = (uint)bVar7 * 0x219392ef | (uint)!bVar7 * aVar3.field_3.a;
    auVar31 = vrcp14ps_avx512vl(auVar32);
    auVar33._8_4_ = 0x3f800000;
    auVar33._0_8_ = 0x3f8000003f800000;
    auVar33._12_4_ = 0x3f800000;
    auVar33 = vfnmadd213ps_avx512vl(auVar32,auVar31,auVar33);
    auVar32 = vfmadd132ps_fma(auVar33,auVar31,auVar31);
    auVar45 = vbroadcastss_avx512vl(auVar32);
    auVar79 = ZEXT3264(auVar45);
    auVar31 = vmovshdup_avx(auVar32);
    auVar45 = vbroadcastsd_avx512vl(auVar31);
    auVar80 = ZEXT3264(auVar45);
    auVar49._8_4_ = 2;
    auVar49._0_8_ = 0x200000002;
    auVar49._12_4_ = 2;
    auVar49._16_4_ = 2;
    auVar49._20_4_ = 2;
    auVar49._24_4_ = 2;
    auVar49._28_4_ = 2;
    auVar33 = vshufpd_avx(auVar32,auVar32,1);
    auVar45 = vpermps_avx512vl(auVar49,ZEXT1632(auVar32));
    auVar81 = ZEXT3264(auVar45);
    fVar54 = auVar32._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar45 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar82 = ZEXT3264(auVar45);
    auVar52._4_4_ = fVar54;
    auVar52._0_4_ = fVar54;
    auVar52._8_4_ = fVar54;
    auVar52._12_4_ = fVar54;
    auVar52._16_4_ = fVar54;
    auVar52._20_4_ = fVar54;
    auVar52._24_4_ = fVar54;
    auVar52._28_4_ = fVar54;
    auVar47 = ZEXT1632(CONCAT412(auVar32._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar32._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar32._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar54))
                                ));
    auVar46 = vpermps_avx512vl(auVar45,auVar47);
    auVar45 = vpermps_avx2(auVar49,auVar47);
    local_25c0 = (ulong)(auVar32._0_4_ < 0.0) << 3;
    uVar8 = (ulong)(auVar31._0_4_ < 0.0) * 8 + 0x10;
    lVar2 = (ulong)(auVar33._0_4_ < 0.0) * 8;
    uVar64 = auVar42._0_4_;
    auVar58 = ZEXT3264(CONCAT428(uVar64,CONCAT424(uVar64,CONCAT420(uVar64,CONCAT416(uVar64,CONCAT412
                                                  (uVar64,CONCAT48(uVar64,CONCAT44(uVar64,uVar64))))
                                                  ))));
    uVar29 = local_25c0 ^ 8;
    auVar48._8_4_ = 0x80000000;
    auVar48._0_8_ = 0x8000000080000000;
    auVar48._12_4_ = 0x80000000;
    auVar48._16_4_ = 0x80000000;
    auVar48._20_4_ = 0x80000000;
    auVar48._24_4_ = 0x80000000;
    auVar48._28_4_ = 0x80000000;
    auVar47 = vxorps_avx512vl(auVar52,auVar48);
    auVar83 = ZEXT3264(auVar47);
    auVar46 = vxorps_avx512vl(auVar46,auVar48);
    auVar84 = ZEXT3264(auVar46);
    auVar45 = vxorps_avx512vl(auVar45,auVar48);
    auVar85 = ZEXT3264(auVar45);
    auVar45 = vbroadcastss_avx512vl(auVar34);
    auVar86 = ZEXT3264(auVar45);
    auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar87 = ZEXT3264(auVar45);
    auVar45 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar88 = ZEXT3264(auVar45);
    auVar34 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar89 = ZEXT1664(auVar34);
    auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar90 = ZEXT3264(auVar45);
    auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
    auVar91 = ZEXT3264(auVar45);
    local_25b0 = context;
    do {
      pfVar1 = (float *)(local_25b8 + -1);
      local_25b8 = local_25b8 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar27 = *local_25b8;
        while ((uVar27 & 8) == 0) {
          pauVar26 = (undefined1 (*) [32])(uVar27 & 0xfffffffffffffff0);
          pauVar23 = pauVar26 + 2;
          if (pauVar26 == (undefined1 (*) [32])0x0) {
            pauVar23 = (undefined1 (*) [32])0x0;
          }
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)*pauVar23;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *(ulong *)(*pauVar23 + 8);
          uVar27 = vpcmpub_avx512vl(auVar39,auVar40,2);
          uVar64 = *(undefined4 *)(pauVar23[1] + 0x10);
          auVar46._4_4_ = uVar64;
          auVar46._0_4_ = uVar64;
          auVar46._8_4_ = uVar64;
          auVar46._12_4_ = uVar64;
          auVar46._16_4_ = uVar64;
          auVar46._20_4_ = uVar64;
          auVar46._24_4_ = uVar64;
          auVar46._28_4_ = uVar64;
          uVar64 = *(undefined4 *)(pauVar23[1] + 0x1c);
          auVar62._4_4_ = uVar64;
          auVar62._0_4_ = uVar64;
          auVar62._8_4_ = uVar64;
          auVar62._12_4_ = uVar64;
          auVar62._16_4_ = uVar64;
          auVar62._20_4_ = uVar64;
          auVar62._24_4_ = uVar64;
          auVar62._28_4_ = uVar64;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(*pauVar23 + local_25c0);
          auVar45 = vpmovzxbd_avx2(auVar34);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar34 = vfmadd213ps_fma(auVar45,auVar62,auVar46);
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(*pauVar23 + uVar29);
          auVar45 = vpmovzxbd_avx2(auVar42);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar42 = vfmadd213ps_fma(auVar45,auVar62,auVar46);
          uVar64 = *(undefined4 *)(pauVar23[1] + 0x14);
          auVar47._4_4_ = uVar64;
          auVar47._0_4_ = uVar64;
          auVar47._8_4_ = uVar64;
          auVar47._12_4_ = uVar64;
          auVar47._16_4_ = uVar64;
          auVar47._20_4_ = uVar64;
          auVar47._24_4_ = uVar64;
          auVar47._28_4_ = uVar64;
          uVar64 = *(undefined4 *)pauVar23[2];
          auVar51._4_4_ = uVar64;
          auVar51._0_4_ = uVar64;
          auVar51._8_4_ = uVar64;
          auVar51._12_4_ = uVar64;
          auVar51._16_4_ = uVar64;
          auVar51._20_4_ = uVar64;
          auVar51._24_4_ = uVar64;
          auVar51._28_4_ = uVar64;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(*pauVar23 + uVar8);
          auVar45 = vpmovzxbd_avx2(auVar38);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar31 = vfmadd213ps_fma(auVar45,auVar51,auVar47);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(*pauVar23 + (uVar8 ^ 8));
          auVar45 = vpmovzxbd_avx2(auVar35);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar33 = vfmadd213ps_fma(auVar45,auVar51,auVar47);
          uVar64 = *(undefined4 *)(pauVar23[1] + 0x18);
          auVar60._4_4_ = uVar64;
          auVar60._0_4_ = uVar64;
          auVar60._8_4_ = uVar64;
          auVar60._12_4_ = uVar64;
          auVar60._16_4_ = uVar64;
          auVar60._20_4_ = uVar64;
          auVar60._24_4_ = uVar64;
          auVar60._28_4_ = uVar64;
          uVar64 = *(undefined4 *)(pauVar23[2] + 4);
          auVar63._4_4_ = uVar64;
          auVar63._0_4_ = uVar64;
          auVar63._8_4_ = uVar64;
          auVar63._12_4_ = uVar64;
          auVar63._16_4_ = uVar64;
          auVar63._20_4_ = uVar64;
          auVar63._24_4_ = uVar64;
          auVar63._28_4_ = uVar64;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)(pauVar23[1] + lVar2);
          auVar45 = vpmovzxbd_avx2(auVar36);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar32 = vfmadd213ps_fma(auVar45,auVar63,auVar60);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = *(ulong *)(*pauVar23 + (lVar2 + 0x20U ^ 8));
          auVar45 = vpmovzxbd_avx2(auVar37);
          auVar45 = vcvtdq2ps_avx(auVar45);
          auVar69 = vfmadd213ps_fma(auVar45,auVar63,auVar60);
          auVar45 = vfmadd213ps_avx512vl(ZEXT1632(auVar34),auVar79._0_32_,auVar83._0_32_);
          auVar46 = vfmadd213ps_avx512vl(ZEXT1632(auVar31),auVar80._0_32_,auVar84._0_32_);
          auVar45 = vpmaxsd_avx2(auVar45,auVar46);
          auVar46 = vfmadd213ps_avx512vl(ZEXT1632(auVar32),auVar81._0_32_,auVar85._0_32_);
          auVar46 = vpmaxsd_avx512vl(auVar46,auVar86._0_32_);
          auVar45 = vpmaxsd_avx2(auVar45,auVar46);
          auVar46 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar79._0_32_,auVar83._0_32_);
          auVar47 = vfmadd213ps_avx512vl(ZEXT1632(auVar33),auVar80._0_32_,auVar84._0_32_);
          auVar46 = vpminsd_avx2(auVar46,auVar47);
          auVar47 = vfmadd213ps_avx512vl(ZEXT1632(auVar69),auVar81._0_32_,auVar85._0_32_);
          auVar47 = vpminsd_avx2(auVar47,auVar58._0_32_);
          auVar46 = vpminsd_avx2(auVar46,auVar47);
          uVar30 = vpcmpd_avx512vl(auVar45,auVar46,2);
          uVar30 = uVar27 & 0xff & uVar30;
          bVar22 = (byte)uVar30;
          if (bVar22 == 0) goto LAB_01f2e2f3;
          auVar46 = *pauVar26;
          auVar47 = pauVar26[1];
          auVar48 = vmovdqa64_avx512vl(auVar87._0_32_);
          auVar48 = vpternlogd_avx512vl(auVar48,auVar45,auVar88._0_32_,0xf8);
          auVar49 = vpcompressd_avx512vl(auVar48);
          auVar50._0_4_ =
               (uint)(bVar22 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar22 & 1) * auVar48._0_4_;
          bVar7 = (bool)((byte)(uVar30 >> 1) & 1);
          auVar50._4_4_ = (uint)bVar7 * auVar49._4_4_ | (uint)!bVar7 * auVar48._4_4_;
          bVar7 = (bool)((byte)(uVar30 >> 2) & 1);
          auVar50._8_4_ = (uint)bVar7 * auVar49._8_4_ | (uint)!bVar7 * auVar48._8_4_;
          bVar7 = (bool)((byte)(uVar30 >> 3) & 1);
          auVar50._12_4_ = (uint)bVar7 * auVar49._12_4_ | (uint)!bVar7 * auVar48._12_4_;
          bVar7 = (bool)((byte)(uVar30 >> 4) & 1);
          auVar50._16_4_ = (uint)bVar7 * auVar49._16_4_ | (uint)!bVar7 * auVar48._16_4_;
          bVar7 = (bool)((byte)(uVar30 >> 5) & 1);
          auVar50._20_4_ = (uint)bVar7 * auVar49._20_4_ | (uint)!bVar7 * auVar48._20_4_;
          bVar7 = (bool)((byte)(uVar30 >> 6) & 1);
          auVar50._24_4_ = (uint)bVar7 * auVar49._24_4_ | (uint)!bVar7 * auVar48._24_4_;
          bVar7 = SUB81(uVar30 >> 7,0);
          auVar50._28_4_ = (uint)bVar7 * auVar49._28_4_ | (uint)!bVar7 * auVar48._28_4_;
          auVar48 = vpermt2q_avx512vl(auVar46,auVar50,auVar47);
          uVar27 = auVar48._0_8_;
          bVar22 = bVar22 - 1 & bVar22;
          if (bVar22 != 0) {
            auVar48 = vpshufd_avx2(auVar50,0x55);
            vpermt2q_avx512vl(auVar46,auVar48,auVar47);
            auVar49 = vpminsd_avx2(auVar50,auVar48);
            auVar48 = vpmaxsd_avx2(auVar50,auVar48);
            bVar22 = bVar22 - 1 & bVar22;
            if (bVar22 == 0) {
              auVar49 = vpermi2q_avx512vl(auVar49,auVar46,auVar47);
              uVar27 = auVar49._0_8_;
              auVar46 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
              *local_25b8 = auVar46._0_8_;
              auVar45 = vpermd_avx2(auVar48,auVar45);
              *(int *)(local_25b8 + 1) = auVar45._0_4_;
              local_25b8 = local_25b8 + 2;
            }
            else {
              auVar60 = vpshufd_avx2(auVar50,0xaa);
              vpermt2q_avx512vl(auVar46,auVar60,auVar47);
              auVar52 = vpminsd_avx2(auVar49,auVar60);
              auVar49 = vpmaxsd_avx2(auVar49,auVar60);
              auVar60 = vpminsd_avx2(auVar48,auVar49);
              auVar48 = vpmaxsd_avx2(auVar48,auVar49);
              bVar22 = bVar22 - 1 & bVar22;
              if (bVar22 == 0) {
                auVar49 = vpermi2q_avx512vl(auVar52,auVar46,auVar47);
                uVar27 = auVar49._0_8_;
                auVar49 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
                *local_25b8 = auVar49._0_8_;
                auVar48 = vpermd_avx2(auVar48,auVar45);
                *(int *)(local_25b8 + 1) = auVar48._0_4_;
                auVar46 = vpermt2q_avx512vl(auVar46,auVar60,auVar47);
                local_25b8[2] = auVar46._0_8_;
                auVar45 = vpermd_avx2(auVar60,auVar45);
                *(int *)(local_25b8 + 3) = auVar45._0_4_;
                local_25b8 = local_25b8 + 4;
              }
              else {
                auVar49 = vpshufd_avx2(auVar50,0xff);
                vpermt2q_avx512vl(auVar46,auVar49,auVar47);
                auVar62 = vpminsd_avx2(auVar52,auVar49);
                auVar49 = vpmaxsd_avx2(auVar52,auVar49);
                auVar52 = vpminsd_avx2(auVar60,auVar49);
                auVar49 = vpmaxsd_avx2(auVar60,auVar49);
                auVar60 = vpminsd_avx2(auVar48,auVar49);
                auVar48 = vpmaxsd_avx2(auVar48,auVar49);
                bVar22 = bVar22 - 1 & bVar22;
                if (bVar22 == 0) {
                  auVar49 = vpermi2q_avx512vl(auVar62,auVar46,auVar47);
                  uVar27 = auVar49._0_8_;
                  auVar49 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
                  *local_25b8 = auVar49._0_8_;
                  auVar48 = vpermd_avx2(auVar48,auVar45);
                  *(int *)(local_25b8 + 1) = auVar48._0_4_;
                  auVar48 = vpermt2q_avx512vl(auVar46,auVar60,auVar47);
                  local_25b8[2] = auVar48._0_8_;
                  auVar48 = vpermd_avx2(auVar60,auVar45);
                  *(int *)(local_25b8 + 3) = auVar48._0_4_;
                  auVar46 = vpermt2q_avx512vl(auVar46,auVar52,auVar47);
                  local_25b8[4] = auVar46._0_8_;
                  auVar45 = vpermd_avx2(auVar52,auVar45);
                  *(int *)(local_25b8 + 5) = auVar45._0_4_;
                  local_25b8 = local_25b8 + 6;
                }
                else {
                  auVar51 = valignd_avx512vl(auVar50,auVar50,3);
                  auVar49 = vmovdqa64_avx512vl(auVar89._0_32_);
                  auVar49 = vpermt2d_avx512vl(auVar49,auVar90._0_32_,auVar62);
                  auVar49 = vpermt2d_avx512vl(auVar49,auVar91._0_32_,auVar52);
                  auVar52 = vpermt2d_avx512vl(auVar49,auVar91._0_32_,auVar60);
                  auVar49 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar48 = vpermt2d_avx512vl(auVar52,auVar49,auVar48);
                  auVar68 = ZEXT3264(auVar48);
                  bVar25 = bVar22;
                  do {
                    auVar49 = auVar68._0_32_;
                    auVar48 = vpermps_avx512vl(auVar82._0_32_,auVar51);
                    auVar51 = valignd_avx512vl(auVar51,auVar51,1);
                    vpermt2q_avx512vl(auVar46,auVar51,auVar47);
                    bVar25 = bVar25 - 1 & bVar25;
                    uVar12 = vpcmpd_avx512vl(auVar48,auVar49,5);
                    auVar48 = vpmaxsd_avx2(auVar48,auVar49);
                    bVar13 = (byte)uVar12 << 1;
                    auVar49 = valignd_avx512vl(auVar49,auVar49,7);
                    bVar7 = (bool)((byte)uVar12 & 1);
                    auVar53._4_4_ = (uint)bVar7 * auVar49._4_4_ | (uint)!bVar7 * auVar48._4_4_;
                    auVar53._0_4_ = auVar48._0_4_;
                    bVar7 = (bool)(bVar13 >> 2 & 1);
                    auVar53._8_4_ = (uint)bVar7 * auVar49._8_4_ | (uint)!bVar7 * auVar48._8_4_;
                    bVar7 = (bool)(bVar13 >> 3 & 1);
                    auVar53._12_4_ = (uint)bVar7 * auVar49._12_4_ | (uint)!bVar7 * auVar48._12_4_;
                    bVar7 = (bool)(bVar13 >> 4 & 1);
                    auVar53._16_4_ = (uint)bVar7 * auVar49._16_4_ | (uint)!bVar7 * auVar48._16_4_;
                    bVar7 = (bool)(bVar13 >> 5 & 1);
                    auVar53._20_4_ = (uint)bVar7 * auVar49._20_4_ | (uint)!bVar7 * auVar48._20_4_;
                    bVar7 = (bool)(bVar13 >> 6 & 1);
                    auVar53._24_4_ = (uint)bVar7 * auVar49._24_4_ | (uint)!bVar7 * auVar48._24_4_;
                    auVar53._28_4_ =
                         (uint)(bVar13 >> 7) * auVar49._28_4_ |
                         (uint)!(bool)(bVar13 >> 7) * auVar48._28_4_;
                    auVar68 = ZEXT3264(auVar53);
                  } while (bVar25 != 0);
                  lVar24 = (ulong)(uint)POPCOUNT((uint)bVar22) + 3;
                  do {
                    auVar48 = vpermi2q_avx512vl(auVar53,auVar46,auVar47);
                    *local_25b8 = auVar48._0_8_;
                    auVar49 = auVar68._0_32_;
                    auVar48 = vpermd_avx2(auVar49,auVar45);
                    *(int *)(local_25b8 + 1) = auVar48._0_4_;
                    auVar53 = valignd_avx512vl(auVar49,auVar49,1);
                    local_25b8 = local_25b8 + 2;
                    auVar68 = ZEXT3264(auVar53);
                    lVar24 = lVar24 + -1;
                  } while (lVar24 != 0);
                  auVar45 = vpermt2q_avx512vl(auVar46,auVar53,auVar47);
                  uVar27 = auVar45._0_8_;
                }
              }
            }
          }
        }
        local_25a0 = (ulong)((uint)uVar27 & 0xf) - 8;
        if (local_25a0 != 0) {
          uVar27 = uVar27 & 0xfffffffffffffff0;
          local_25a8 = 0;
          do {
            lVar24 = local_25a8 * 0xb0;
            auVar34 = *(undefined1 (*) [16])(uVar27 + 0x80 + lVar24);
            auVar42 = *(undefined1 (*) [16])(uVar27 + 0x40 + lVar24);
            auVar31 = *(undefined1 (*) [16])(uVar27 + 0x70 + lVar24);
            auVar33 = *(undefined1 (*) [16])(uVar27 + 0x50 + lVar24);
            auVar55._0_4_ = auVar42._0_4_ * auVar34._0_4_;
            auVar55._4_4_ = auVar42._4_4_ * auVar34._4_4_;
            auVar55._8_4_ = auVar42._8_4_ * auVar34._8_4_;
            auVar55._12_4_ = auVar42._12_4_ * auVar34._12_4_;
            auVar32 = *(undefined1 (*) [16])(uVar27 + 0x60 + lVar24);
            auVar69 = *(undefined1 (*) [16])(uVar27 + 0x30 + lVar24);
            local_2488 = vfmsub231ps_fma(auVar55,auVar31,auVar33);
            auVar59._0_4_ = auVar33._0_4_ * auVar32._0_4_;
            auVar59._4_4_ = auVar33._4_4_ * auVar32._4_4_;
            auVar59._8_4_ = auVar33._8_4_ * auVar32._8_4_;
            auVar59._12_4_ = auVar33._12_4_ * auVar32._12_4_;
            local_2478 = vfmsub231ps_fma(auVar59,auVar34,auVar69);
            auVar61._0_4_ = auVar69._0_4_ * auVar31._0_4_;
            auVar61._4_4_ = auVar69._4_4_ * auVar31._4_4_;
            auVar61._8_4_ = auVar69._8_4_ * auVar31._8_4_;
            auVar61._12_4_ = auVar69._12_4_ * auVar31._12_4_;
            uVar64 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar75._4_4_ = uVar64;
            auVar75._0_4_ = uVar64;
            auVar75._8_4_ = uVar64;
            auVar75._12_4_ = uVar64;
            uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar76._4_4_ = uVar64;
            auVar76._0_4_ = uVar64;
            auVar76._8_4_ = uVar64;
            auVar76._12_4_ = uVar64;
            fVar54 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar77._4_4_ = fVar54;
            auVar77._0_4_ = fVar54;
            auVar77._8_4_ = fVar54;
            auVar77._12_4_ = fVar54;
            uVar64 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar41._4_4_ = uVar64;
            auVar41._0_4_ = uVar64;
            auVar41._8_4_ = uVar64;
            auVar41._12_4_ = uVar64;
            auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + lVar24),auVar41);
            local_2468 = vfmsub231ps_fma(auVar61,auVar32,auVar42);
            uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar14._4_4_ = uVar64;
            auVar14._0_4_ = uVar64;
            auVar14._8_4_ = uVar64;
            auVar14._12_4_ = uVar64;
            auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x10 + lVar24),auVar14);
            uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar15._4_4_ = uVar64;
            auVar15._0_4_ = uVar64;
            auVar15._8_4_ = uVar64;
            auVar15._12_4_ = uVar64;
            auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x20 + lVar24),auVar15);
            auVar38 = vmulps_avx512vl(auVar76,auVar37);
            auVar39 = vfmsub231ps_avx512vl(auVar38,auVar36,auVar77);
            auVar38 = vmulps_avx512vl(auVar77,auVar35);
            auVar40 = vfmsub231ps_avx512vl(auVar38,auVar37,auVar75);
            auVar38 = vmulps_avx512vl(auVar75,auVar36);
            auVar41 = vfmsub231ps_avx512vl(auVar38,auVar35,auVar76);
            auVar78._0_4_ = fVar54 * local_2468._0_4_;
            auVar78._4_4_ = fVar54 * local_2468._4_4_;
            auVar78._8_4_ = fVar54 * local_2468._8_4_;
            auVar78._12_4_ = fVar54 * local_2468._12_4_;
            auVar38 = vfmadd231ps_fma(auVar78,local_2478,auVar76);
            auVar38 = vfmadd231ps_fma(auVar38,local_2488,auVar75);
            auVar16._8_4_ = 0x7fffffff;
            auVar16._0_8_ = 0x7fffffff7fffffff;
            auVar16._12_4_ = 0x7fffffff;
            local_24d8 = vandps_avx512vl(auVar38,auVar16);
            auVar34 = vmulps_avx512vl(auVar34,auVar41);
            auVar34 = vfmadd231ps_avx512vl(auVar34,auVar40,auVar31);
            auVar34 = vfmadd231ps_avx512vl(auVar34,auVar39,auVar32);
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar31 = vandpd_avx512vl(auVar38,auVar17);
            uVar71 = auVar31._0_4_;
            local_2508._0_4_ = (float)(uVar71 ^ auVar34._0_4_);
            uVar28 = auVar31._4_4_;
            local_2508._4_4_ = (float)(uVar28 ^ auVar34._4_4_);
            uVar72 = auVar31._8_4_;
            local_2508._8_4_ = (float)(uVar72 ^ auVar34._8_4_);
            uVar73 = auVar31._12_4_;
            local_2508._12_4_ = (float)(uVar73 ^ auVar34._12_4_);
            auVar34 = vmulps_avx512vl(auVar33,auVar41);
            auVar34 = vfmadd231ps_avx512vl(auVar34,auVar42,auVar40);
            auVar34 = vfmadd231ps_avx512vl(auVar34,auVar69,auVar39);
            local_24f8._0_4_ = (float)(uVar71 ^ auVar34._0_4_);
            local_24f8._4_4_ = (float)(uVar28 ^ auVar34._4_4_);
            local_24f8._8_4_ = (float)(uVar72 ^ auVar34._8_4_);
            local_24f8._12_4_ = (float)(uVar73 ^ auVar34._12_4_);
            auVar34 = ZEXT816(0) << 0x20;
            uVar12 = vcmpps_avx512vl(local_2508,auVar34,5);
            uVar9 = vcmpps_avx512vl(local_24f8,auVar34,5);
            uVar10 = vcmpps_avx512vl(auVar38,auVar34,4);
            auVar74._0_4_ = local_2508._0_4_ + local_24f8._0_4_;
            auVar74._4_4_ = local_2508._4_4_ + local_24f8._4_4_;
            auVar74._8_4_ = local_2508._8_4_ + local_24f8._8_4_;
            auVar74._12_4_ = local_2508._12_4_ + local_24f8._12_4_;
            uVar11 = vcmpps_avx512vl(auVar74,local_24d8,2);
            local_24c7 = (byte)uVar12 & (byte)uVar9 & (byte)uVar10 & (byte)uVar11;
            if (local_24c7 != 0) {
              auVar70._0_4_ = auVar37._0_4_ * local_2468._0_4_;
              auVar70._4_4_ = auVar37._4_4_ * local_2468._4_4_;
              auVar70._8_4_ = auVar37._8_4_ * local_2468._8_4_;
              auVar70._12_4_ = auVar37._12_4_ * local_2468._12_4_;
              auVar34 = vfmadd213ps_fma(auVar36,local_2478,auVar70);
              auVar34 = vfmadd213ps_fma(auVar35,local_2488,auVar34);
              local_24e8._0_4_ = (float)(uVar71 ^ auVar34._0_4_);
              local_24e8._4_4_ = (float)(uVar28 ^ auVar34._4_4_);
              local_24e8._8_4_ = (float)(uVar72 ^ auVar34._8_4_);
              local_24e8._12_4_ = (float)(uVar73 ^ auVar34._12_4_);
              uVar64 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar18._4_4_ = uVar64;
              auVar18._0_4_ = uVar64;
              auVar18._8_4_ = uVar64;
              auVar18._12_4_ = uVar64;
              auVar34 = vmulps_avx512vl(local_24d8,auVar18);
              fVar54 = (ray->super_RayK<1>).tfar;
              auVar19._4_4_ = fVar54;
              auVar19._0_4_ = fVar54;
              auVar19._8_4_ = fVar54;
              auVar19._12_4_ = fVar54;
              auVar42 = vmulps_avx512vl(local_24d8,auVar19);
              uVar12 = vcmpps_avx512vl(local_24e8,auVar42,2);
              uVar9 = vcmpps_avx512vl(auVar34,local_24e8,1);
              local_24c7 = (byte)uVar12 & (byte)uVar9 & local_24c7;
              if (local_24c7 != 0) {
                lVar24 = lVar24 + uVar27;
                auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                auVar4._4_4_ = (ray->super_RayK<1>).mask;
                auVar4._8_4_ = (ray->super_RayK<1>).id;
                auVar4._12_4_ = (ray->super_RayK<1>).flags;
                auVar68 = ZEXT1664(auVar4);
                local_25ec = (uint)local_24c7;
                uVar71 = vextractps_avx(auVar4,1);
                auVar34 = vrcp14ps_avx512vl(local_24d8);
                auVar20._8_4_ = 0x3f800000;
                auVar20._0_8_ = 0x3f8000003f800000;
                auVar20._12_4_ = 0x3f800000;
                auVar42 = vfnmadd213ps_avx512vl(local_24d8,auVar34,auVar20);
                auVar34 = vfmadd132ps_fma(auVar42,auVar34,auVar34);
                fVar54 = auVar34._0_4_;
                local_2498._0_4_ = fVar54 * local_24e8._0_4_;
                fVar65 = auVar34._4_4_;
                local_2498._4_4_ = fVar65 * local_24e8._4_4_;
                fVar66 = auVar34._8_4_;
                local_2498._8_4_ = fVar66 * local_24e8._8_4_;
                fVar67 = auVar34._12_4_;
                local_2498._12_4_ = fVar67 * local_24e8._12_4_;
                auVar58 = ZEXT1664(local_2498);
                local_24b8[0] = fVar54 * local_2508._0_4_;
                local_24b8[1] = fVar65 * local_2508._4_4_;
                local_24b8[2] = fVar66 * local_2508._8_4_;
                local_24b8[3] = fVar67 * local_2508._12_4_;
                local_24a8[0] = fVar54 * local_24f8._0_4_;
                local_24a8[1] = fVar65 * local_24f8._4_4_;
                local_24a8[2] = fVar66 * local_24f8._8_4_;
                local_24a8[3] = fVar67 * local_24f8._12_4_;
                auVar56._8_4_ = 0x7f800000;
                auVar56._0_8_ = 0x7f8000007f800000;
                auVar56._12_4_ = 0x7f800000;
                auVar34 = vblendmps_avx512vl(auVar56,local_2498);
                auVar43._0_4_ =
                     (uint)(local_24c7 & 1) * auVar34._0_4_ |
                     (uint)!(bool)(local_24c7 & 1) * 0x7f800000;
                bVar7 = (bool)(local_24c7 >> 1 & 1);
                auVar43._4_4_ = (uint)bVar7 * auVar34._4_4_ | (uint)!bVar7 * 0x7f800000;
                bVar7 = (bool)(local_24c7 >> 2 & 1);
                auVar43._8_4_ = (uint)bVar7 * auVar34._8_4_ | (uint)!bVar7 * 0x7f800000;
                bVar7 = (bool)(local_24c7 >> 3 & 1);
                auVar43._12_4_ = (uint)bVar7 * auVar34._12_4_ | (uint)!bVar7 * 0x7f800000;
                auVar34 = vshufps_avx(auVar43,auVar43,0xb1);
                auVar34 = vminps_avx(auVar34,auVar43);
                auVar42 = vshufpd_avx(auVar34,auVar34,1);
                auVar34 = vminps_avx(auVar42,auVar34);
                uVar12 = vcmpps_avx512vl(auVar43,auVar34,0);
                uVar28 = local_25ec;
                if (((byte)uVar12 & local_24c7) != 0) {
                  uVar28 = (uint)((byte)uVar12 & local_24c7);
                }
                uVar72 = 0;
                for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
                  uVar72 = uVar72 + 1;
                }
                local_2590 = local_25b0->scene;
                do {
                  local_2528 = auVar68._0_16_;
                  local_2518 = auVar58._0_16_;
                  uVar28 = uVar72 & 0xff;
                  local_2540 = *(uint *)(lVar24 + 0x90 + (ulong)uVar28 * 4);
                  local_2598 = (local_2590->geometries).items[local_2540].ptr;
                  if ((local_2598->mask & uVar71) == 0) {
                    bVar22 = ~(byte)(1 << (uVar72 & 0x1f)) & (byte)local_25ec;
                  }
                  else {
                    pRVar6 = local_25b0->args;
                    local_2458 = auVar86._0_32_;
                    local_2438 = auVar85._0_32_;
                    local_2418 = auVar84._0_32_;
                    local_23f8 = auVar83._0_32_;
                    local_23d8 = auVar81._0_32_;
                    local_23b8 = auVar80._0_32_;
                    local_2398 = auVar79._0_32_;
                    if (pRVar6->filter == (RTCFilterFunctionN)0x0) {
                      local_2588.context = local_25b0->user;
                      if (local_2598->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar30 = (ulong)(uVar28 << 2);
                        fVar54 = *(float *)((long)local_24b8 + uVar30);
                        fVar65 = *(float *)((long)local_24a8 + uVar30);
                        (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar30);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_2488 + uVar30);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_2478 + uVar30);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_2468 + uVar30);
                        ray->u = fVar54;
                        ray->v = fVar65;
                        ray->primID = *(uint *)(lVar24 + 0xa0 + uVar30);
                        ray->geomID = local_2540;
                        ray->instID[0] = (local_2588.context)->instID[0];
                        ray->instPrimID[0] = (local_2588.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_2588.context = local_25b0->user;
                    }
                    uVar30 = (ulong)(uVar28 * 4);
                    local_2558 = *(float *)(local_2488 + uVar30);
                    local_2554 = *(undefined4 *)(local_2478 + uVar30);
                    local_2550 = *(undefined4 *)(local_2468 + uVar30);
                    local_254c = *(undefined4 *)((long)local_24b8 + uVar30);
                    local_2548 = *(undefined4 *)((long)local_24a8 + uVar30);
                    local_2544 = *(undefined4 *)(lVar24 + 0xa0 + uVar30);
                    local_253c = (local_2588.context)->instID[0];
                    local_2538 = (local_2588.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar30);
                    local_25c4 = -1;
                    local_2588.valid = &local_25c4;
                    local_2588.geometryUserPtr = local_2598->userPtr;
                    local_2588.ray = (RTCRayN *)ray;
                    local_2588.hit = (RTCHitN *)&local_2558;
                    local_2588.N = 1;
                    if (((local_2598->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_2598->intersectionFilterN)(&local_2588), *local_2588.valid != 0))
                       && ((pRVar6->filter == (RTCFilterFunctionN)0x0 ||
                           ((((pRVar6->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((local_2598->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*pRVar6->filter)(&local_2588), *local_2588.valid != 0)))))) {
                      (((Vec3f *)((long)local_2588.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2588.hit;
                      (((Vec3f *)((long)local_2588.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2588.hit + 4);
                      (((Vec3f *)((long)local_2588.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2588.hit + 8);
                      *(float *)((long)local_2588.ray + 0x3c) = *(float *)(local_2588.hit + 0xc);
                      *(float *)((long)local_2588.ray + 0x40) = *(float *)(local_2588.hit + 0x10);
                      *(float *)((long)local_2588.ray + 0x44) = *(float *)(local_2588.hit + 0x14);
                      *(float *)((long)local_2588.ray + 0x48) = *(float *)(local_2588.hit + 0x18);
                      *(float *)((long)local_2588.ray + 0x4c) = *(float *)(local_2588.hit + 0x1c);
                      *(float *)((long)local_2588.ray + 0x50) = *(float *)(local_2588.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_2528._0_4_;
                    }
                    auVar5._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar5._4_4_ = (ray->super_RayK<1>).mask;
                    auVar5._8_4_ = (ray->super_RayK<1>).id;
                    auVar5._12_4_ = (ray->super_RayK<1>).flags;
                    auVar68 = ZEXT1664(auVar5);
                    auVar58 = ZEXT1664(local_2518);
                    fVar54 = (ray->super_RayK<1>).tfar;
                    auVar21._4_4_ = fVar54;
                    auVar21._0_4_ = fVar54;
                    auVar21._8_4_ = fVar54;
                    auVar21._12_4_ = fVar54;
                    uVar12 = vcmpps_avx512vl(local_2518,auVar21,2);
                    bVar22 = ~(byte)(1 << (uVar72 & 0x1f)) & (byte)local_25ec & (byte)uVar12;
                    uVar71 = vextractps_avx(auVar5,1);
                    auVar79 = ZEXT3264(local_2398);
                    auVar80 = ZEXT3264(local_23b8);
                    auVar81 = ZEXT3264(local_23d8);
                    auVar45 = vbroadcastss_avx512vl(ZEXT416(1));
                    auVar82 = ZEXT3264(auVar45);
                    auVar83 = ZEXT3264(local_23f8);
                    auVar84 = ZEXT3264(local_2418);
                    auVar85 = ZEXT3264(local_2438);
                    auVar86 = ZEXT3264(local_2458);
                    auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar87 = ZEXT3264(auVar45);
                    auVar45 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar88 = ZEXT3264(auVar45);
                    auVar34 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                    auVar89 = ZEXT1664(auVar34);
                    auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                    auVar90 = ZEXT3264(auVar45);
                    auVar45 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                    auVar91 = ZEXT3264(auVar45);
                  }
                  local_25ec = (uint)bVar22;
                  if (bVar22 == 0) break;
                  auVar57._8_4_ = 0x7f800000;
                  auVar57._0_8_ = 0x7f8000007f800000;
                  auVar57._12_4_ = 0x7f800000;
                  auVar34 = vblendmps_avx512vl(auVar57,auVar58._0_16_);
                  auVar44._0_4_ =
                       (uint)(bVar22 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar22 & 1) * 0x7f800000;
                  bVar7 = (bool)(bVar22 >> 1 & 1);
                  auVar44._4_4_ = (uint)bVar7 * auVar34._4_4_ | (uint)!bVar7 * 0x7f800000;
                  bVar7 = (bool)(bVar22 >> 2 & 1);
                  auVar44._8_4_ = (uint)bVar7 * auVar34._8_4_ | (uint)!bVar7 * 0x7f800000;
                  bVar7 = (bool)(bVar22 >> 3 & 1);
                  auVar44._12_4_ = (uint)bVar7 * auVar34._12_4_ | (uint)!bVar7 * 0x7f800000;
                  auVar34 = vshufps_avx(auVar44,auVar44,0xb1);
                  auVar34 = vminps_avx(auVar34,auVar44);
                  auVar42 = vshufpd_avx(auVar34,auVar34,1);
                  auVar34 = vminps_avx(auVar42,auVar34);
                  uVar12 = vcmpps_avx512vl(auVar44,auVar34,0);
                  bVar22 = (byte)uVar12 & bVar22;
                  uVar28 = local_25ec;
                  if (bVar22 != 0) {
                    uVar28 = (uint)bVar22;
                  }
                  uVar72 = 0;
                  for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000) {
                    uVar72 = uVar72 + 1;
                  }
                } while( true );
              }
            }
            local_25a8 = local_25a8 + 1;
          } while (local_25a8 != local_25a0);
        }
        fVar54 = (ray->super_RayK<1>).tfar;
        auVar58 = ZEXT3264(CONCAT428(fVar54,CONCAT424(fVar54,CONCAT420(fVar54,CONCAT416(fVar54,
                                                  CONCAT412(fVar54,CONCAT48(fVar54,CONCAT44(fVar54,
                                                  fVar54))))))));
      }
LAB_01f2e2f3:
    } while (local_25b8 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }